

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O2

SimComponent * __thiscall lsim::Simulator::create_component(Simulator *this,ModelComponent *desc)

{
  pointer pSVar1;
  bool bVar2;
  pointer result;
  __single_object sim_comp;
  ModelComponent *desc_local;
  unsigned_long local_28;
  
  local_28 = CONCAT44(local_28._4_4_,
                      (int)((ulong)((long)(this->m_components).
                                          super__Vector_base<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_components).
                                         super__Vector_base<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  result = (pointer)this;
  desc_local = desc;
  std::make_unique<lsim::SimComponent,lsim::Simulator*,lsim::ModelComponent*&,unsigned_int>
            ((Simulator **)&sim_comp,(ModelComponent **)&result,(uint *)&desc_local);
  result = (pointer)sim_comp._M_t.
                    super___uniq_ptr_impl<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_lsim::SimComponent_*,_std::default_delete<lsim::SimComponent>_>
                    .super__Head_base<0UL,_lsim::SimComponent_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<lsim::SimComponent,std::default_delete<lsim::SimComponent>>,std::allocator<std::unique_ptr<lsim::SimComponent,std::default_delete<lsim::SimComponent>>>>
  ::emplace_back<std::unique_ptr<lsim::SimComponent,std::default_delete<lsim::SimComponent>>>
            ((vector<std::unique_ptr<lsim::SimComponent,std::default_delete<lsim::SimComponent>>,std::allocator<std::unique_ptr<lsim::SimComponent,std::default_delete<lsim::SimComponent>>>>
              *)&this->m_components,&sim_comp);
  local_28 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->m_input_changed,&local_28);
  bVar2 = component_has_function(this,desc_local->m_type,0);
  if (bVar2) {
    std::vector<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>::push_back
              (&this->m_init_components,&result);
  }
  bVar2 = component_has_function(this,desc_local->m_type,2);
  if (bVar2) {
    std::vector<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>::push_back
              (&this->m_independent_components,&result);
  }
  pSVar1 = result;
  std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>::~unique_ptr
            (&sim_comp);
  return pSVar1;
}

Assistant:

SimComponent *Simulator::create_component(ModelComponent *desc) {
    auto sim_comp = std::make_unique<SimComponent>(this, desc, static_cast<uint32_t> (m_components.size()));
    auto result = sim_comp.get();

    m_components.push_back(std::move(sim_comp));
	m_input_changed.push_back(0);

    if (component_has_function(desc->type(), SIM_FUNCTION_SETUP)) {
        m_init_components.push_back(result);       
    }

    if (component_has_function(desc->type(), SIM_FUNCTION_INDEPENDENT)) {
        m_independent_components.push_back(result);
    }

    return result;
}